

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_suite.cpp
# Opt level: O1

void api_dynamic_suite::dynamic_subspan(void)

{
  int array [4];
  undefined8 local_48;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  local_38 = 0xb;
  uStack_34 = 0x16;
  uStack_30 = 0x21;
  uStack_2c = 0x2c;
  local_48 = 4;
  local_3c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xba,"void api_dynamic_suite::dynamic_subspan()",&local_48,&local_3c);
  local_48 = CONCAT44(local_48._4_4_,0xb);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xbb,"void api_dynamic_suite::dynamic_subspan()",&local_38,&local_48);
  local_48 = 2;
  local_3c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("subspan.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xbd,"void api_dynamic_suite::dynamic_subspan()",&local_48,&local_3c);
  local_48 = CONCAT44(local_48._4_4_,0x21);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("subspan.front()","33",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xbe,"void api_dynamic_suite::dynamic_subspan()",&uStack_30,&local_48);
  return;
}

Assistant:

void dynamic_subspan()
{
    int array[4] = { 11, 22, 33, 44 };
    vista::span<int> span(array);
    BOOST_TEST_EQ(span.size(), 4);
    BOOST_TEST_EQ(span.front(), 11);
    auto subspan = span.subspan<2>();
    BOOST_TEST_EQ(subspan.size(), 2);
    BOOST_TEST_EQ(subspan.front(), 33);
}